

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O1

void bloaty::macho::ParseLoadCommand(LoadCommand *cmd,RangeSink *sink)

{
  uint32_t uVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  macho *this;
  RangeSink *in_R8;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  uint64_t fileoff;
  ulong uVar8;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view label;
  
  uVar1 = cmd->cmd;
  if (10 < (int)uVar1) {
    switch(uVar1) {
    case 0x19:
      ParseSegment<segment_command_64,section_64>(*cmd,sink);
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1f:
    case 0x20:
    case 0x21:
switchD_00188ae7_caseD_27:
      return;
    case 0x1d:
      pcVar3 = "Code Signature";
      this = (macho *)0xe;
      break;
    case 0x1e:
      pcVar3 = "Segment Split Info";
LAB_00189031:
      this = (macho *)0x12;
      break;
    case 0x22:
      goto switchD_00188b30_caseD_22;
    default:
      switch(uVar1) {
      case 0x26:
        pcVar3 = "Function Start Addresses";
        this = (macho *)0x18;
        break;
      case 0x27:
      case 0x28:
      case 0x2a:
      case 0x2c:
      case 0x2d:
        goto switchD_00188ae7_caseD_27;
      case 0x29:
        pcVar3 = "Table of Non-instructions";
        this = (macho *)0x19;
        break;
      case 0x2b:
        pcVar3 = "Code Signing DRs";
        this = (macho *)0x10;
        break;
      case 0x2e:
        pcVar3 = "Optimization Hints";
        goto LAB_00189031;
      default:
        if (uVar1 != 0xb) {
          return;
        }
        if ((cmd->command_data)._M_len < 0x50) goto LAB_0018908c;
        pcVar3 = (cmd->command_data)._M_str;
        uVar2 = (cmd->file_data)._M_len;
        uVar5 = (ulong)*(uint *)(pcVar3 + 0x20);
        if (uVar5 + (ulong)*(uint *)(pcVar3 + 0x24) * 8 <= uVar2) {
          if (uVar5 <= uVar2) {
            pcVar6 = (cmd->file_data)._M_str + uVar5;
            pcVar7 = (sink->file_->data_)._M_str;
            if ((pcVar7 <= pcVar6) && (pcVar6 < pcVar7 + (sink->file_->data_)._M_len)) {
              uVar8 = (ulong)*(uint *)(pcVar3 + 0x24) << 3;
              if (uVar2 - uVar5 < uVar8) {
                uVar8 = uVar2 - uVar5;
              }
              name_05._M_str = "Table of Contents";
              name_05._M_len = 0x11;
              RangeSink::AddFileRange
                        (sink,"macho_dynsymtab",name_05,(long)pcVar6 - (long)pcVar7,uVar8);
            }
            uVar2 = (cmd->file_data)._M_len;
            uVar5 = (ulong)*(uint *)(pcVar3 + 0x28);
            uVar8 = (ulong)*(uint *)(pcVar3 + 0x2c) * 0x38;
            if (uVar2 < uVar8 + uVar5) goto LAB_00189063;
            if (uVar5 <= uVar2) {
              pcVar6 = (cmd->file_data)._M_str + uVar5;
              pcVar7 = (sink->file_->data_)._M_str;
              if ((pcVar7 <= pcVar6) && (pcVar6 < pcVar7 + (sink->file_->data_)._M_len)) {
                if (uVar2 - uVar5 < uVar8) {
                  uVar8 = uVar2 - uVar5;
                }
                name_06._M_str = "Module Table";
                name_06._M_len = 0xc;
                RangeSink::AddFileRange
                          (sink,"macho_dynsymtab",name_06,(long)pcVar6 - (long)pcVar7,uVar8);
              }
              uVar2 = (cmd->file_data)._M_len;
              uVar5 = (ulong)*(uint *)(pcVar3 + 0x30);
              if (uVar2 < uVar5 + (ulong)*(uint *)(pcVar3 + 0x34) * 4) goto LAB_00189063;
              if (uVar5 <= uVar2) {
                pcVar6 = (cmd->file_data)._M_str + uVar5;
                pcVar7 = (sink->file_->data_)._M_str;
                if ((pcVar7 <= pcVar6) && (pcVar6 < pcVar7 + (sink->file_->data_)._M_len)) {
                  uVar8 = (ulong)*(uint *)(pcVar3 + 0x34) << 2;
                  if (uVar2 - uVar5 < uVar8) {
                    uVar8 = uVar2 - uVar5;
                  }
                  name_07._M_str = "Referenced Symbol Table";
                  name_07._M_len = 0x17;
                  RangeSink::AddFileRange
                            (sink,"macho_dynsymtab",name_07,(long)pcVar6 - (long)pcVar7,uVar8);
                }
                uVar2 = (cmd->file_data)._M_len;
                uVar5 = (ulong)*(uint *)(pcVar3 + 0x38);
                if (uVar2 < uVar5 + (ulong)*(uint *)(pcVar3 + 0x3c) * 4) goto LAB_00189063;
                if (uVar5 <= uVar2) {
                  pcVar6 = (cmd->file_data)._M_str + uVar5;
                  pcVar7 = (sink->file_->data_)._M_str;
                  if ((pcVar7 <= pcVar6) && (pcVar6 < pcVar7 + (sink->file_->data_)._M_len)) {
                    uVar8 = (ulong)*(uint *)(pcVar3 + 0x3c) << 2;
                    if (uVar2 - uVar5 < uVar8) {
                      uVar8 = uVar2 - uVar5;
                    }
                    name_08._M_str = "Indirect Symbol Table";
                    name_08._M_len = 0x15;
                    RangeSink::AddFileRange
                              (sink,"macho_dynsymtab",name_08,(long)pcVar6 - (long)pcVar7,uVar8);
                  }
                  uVar2 = (cmd->file_data)._M_len;
                  uVar5 = (ulong)*(uint *)(pcVar3 + 0x40);
                  if (uVar2 < uVar5 + (ulong)*(uint *)(pcVar3 + 0x44) * 8) goto LAB_00189063;
                  if (uVar5 <= uVar2) {
                    pcVar6 = (cmd->file_data)._M_str + uVar5;
                    pcVar7 = (sink->file_->data_)._M_str;
                    if ((pcVar7 <= pcVar6) && (pcVar6 < pcVar7 + (sink->file_->data_)._M_len)) {
                      uVar8 = (ulong)*(uint *)(pcVar3 + 0x44) << 3;
                      if (uVar2 - uVar5 < uVar8) {
                        uVar8 = uVar2 - uVar5;
                      }
                      name_09._M_str = "External Relocation Entries";
                      name_09._M_len = 0x1b;
                      RangeSink::AddFileRange
                                (sink,"macho_dynsymtab",name_09,(long)pcVar6 - (long)pcVar7,uVar8);
                    }
                    uVar2 = (cmd->file_data)._M_len;
                    uVar5 = (ulong)*(uint *)(pcVar3 + 0x48);
                    if (uVar2 < uVar5 + (ulong)*(uint *)(pcVar3 + 0x4c) * 8) goto LAB_00189063;
                    if (uVar5 <= uVar2) {
                      pcVar6 = (cmd->file_data)._M_str + uVar5;
                      pcVar7 = (sink->file_->data_)._M_str;
                      if (pcVar6 < pcVar7) {
                        return;
                      }
                      if (pcVar7 + (sink->file_->data_)._M_len <= pcVar6) {
                        return;
                      }
                      uVar8 = (ulong)*(uint *)(pcVar3 + 0x4c) << 3;
                      if (uVar2 - uVar5 < uVar8) {
                        uVar8 = uVar2 - uVar5;
                      }
                      fileoff = (long)pcVar6 - (long)pcVar7;
                      pcVar7 = "macho_dynsymtab";
                      pcVar3 = "Local Relocation Entries";
                      sVar4 = 0x18;
                      goto LAB_00188d67;
                    }
                  }
                }
              }
            }
          }
          goto LAB_00189074;
        }
        goto LAB_00189063;
      }
    }
    label._M_str = &cmd->is64bit;
    label._M_len = (size_t)pcVar3;
    ParseLinkeditCommand(this,label,(LoadCommand *)sink,in_R8);
    return;
  }
  if (uVar1 != 0x80000022) {
    if (uVar1 == 1) {
      ParseSegment<segment_command,section>(*cmd,sink);
      return;
    }
    if (uVar1 != 2) {
      return;
    }
    if ((cmd->command_data)._M_len < 0x18) goto LAB_0018908c;
    pcVar3 = (cmd->command_data)._M_str;
    uVar2 = (cmd->file_data)._M_len;
    uVar5 = (ulong)*(uint *)(pcVar3 + 8);
    uVar8 = (ulong)*(uint *)(pcVar3 + 0xc) * ((ulong)cmd->is64bit * 4 + 0xc);
    if (uVar2 < uVar8 + uVar5) goto LAB_00189063;
    if (uVar5 <= uVar2) {
      pcVar6 = (cmd->file_data)._M_str + uVar5;
      pcVar7 = (sink->file_->data_)._M_str;
      if ((pcVar7 <= pcVar6) && (pcVar6 < pcVar7 + (sink->file_->data_)._M_len)) {
        if (uVar2 - uVar5 < uVar8) {
          uVar8 = uVar2 - uVar5;
        }
        name._M_str = "Symbol Table";
        name._M_len = 0xc;
        RangeSink::AddFileRange(sink,"macho_symtab",name,(long)pcVar6 - (long)pcVar7,uVar8);
      }
      uVar2 = (cmd->file_data)._M_len;
      uVar5 = (ulong)*(uint *)(pcVar3 + 0x10);
      uVar8 = (ulong)*(uint *)(pcVar3 + 0x14);
      if (uVar2 < uVar8 + uVar5) goto LAB_00189063;
      if (uVar2 < uVar5) goto LAB_00189074;
      pcVar7 = (cmd->file_data)._M_str + uVar5;
      pcVar3 = (sink->file_->data_)._M_str;
      if (pcVar7 < pcVar3) {
        return;
      }
      if (pcVar3 + (sink->file_->data_)._M_len <= pcVar7) {
        return;
      }
      if (uVar2 - uVar5 < uVar8) {
        uVar8 = uVar2 - uVar5;
      }
      fileoff = (long)pcVar7 - (long)pcVar3;
      pcVar7 = "macho_symtab";
      pcVar3 = "String Table";
      sVar4 = 0xc;
      goto LAB_00188d67;
    }
    goto LAB_00189074;
  }
switchD_00188b30_caseD_22:
  if ((cmd->command_data)._M_len < 0x30) {
LAB_0018908c:
    Throw("Premature EOF reading Mach-O data.",0x36);
  }
  pcVar3 = (cmd->command_data)._M_str;
  uVar2 = (cmd->file_data)._M_len;
  uVar5 = (ulong)*(uint *)(pcVar3 + 8);
  uVar8 = (ulong)*(uint *)(pcVar3 + 0xc);
  if (uVar8 + uVar5 <= uVar2) {
    if (uVar5 <= uVar2) {
      pcVar6 = (cmd->file_data)._M_str + uVar5;
      pcVar7 = (sink->file_->data_)._M_str;
      if ((pcVar7 <= pcVar6) && (pcVar6 < pcVar7 + (sink->file_->data_)._M_len)) {
        if (uVar2 - uVar5 < uVar8) {
          uVar8 = uVar2 - uVar5;
        }
        name_00._M_str = "Rebase Info";
        name_00._M_len = 0xb;
        RangeSink::AddFileRange(sink,"macho_dyld",name_00,(long)pcVar6 - (long)pcVar7,uVar8);
      }
      uVar2 = (cmd->file_data)._M_len;
      uVar5 = (ulong)*(uint *)(pcVar3 + 0x10);
      uVar8 = (ulong)*(uint *)(pcVar3 + 0x14);
      if (uVar2 < uVar8 + uVar5) goto LAB_00189063;
      if (uVar5 <= uVar2) {
        pcVar6 = (cmd->file_data)._M_str + uVar5;
        pcVar7 = (sink->file_->data_)._M_str;
        if ((pcVar7 <= pcVar6) && (pcVar6 < pcVar7 + (sink->file_->data_)._M_len)) {
          if (uVar2 - uVar5 < uVar8) {
            uVar8 = uVar2 - uVar5;
          }
          name_01._M_str = "Binding Info";
          name_01._M_len = 0xc;
          RangeSink::AddFileRange(sink,"macho_dyld",name_01,(long)pcVar6 - (long)pcVar7,uVar8);
        }
        uVar2 = (cmd->file_data)._M_len;
        uVar5 = (ulong)*(uint *)(pcVar3 + 0x18);
        uVar8 = (ulong)*(uint *)(pcVar3 + 0x1c);
        if (uVar2 < uVar8 + uVar5) goto LAB_00189063;
        if (uVar5 <= uVar2) {
          pcVar6 = (cmd->file_data)._M_str + uVar5;
          pcVar7 = (sink->file_->data_)._M_str;
          if ((pcVar7 <= pcVar6) && (pcVar6 < pcVar7 + (sink->file_->data_)._M_len)) {
            if (uVar2 - uVar5 < uVar8) {
              uVar8 = uVar2 - uVar5;
            }
            name_02._M_str = "Weak Binding Info";
            name_02._M_len = 0x11;
            RangeSink::AddFileRange(sink,"macho_dyld",name_02,(long)pcVar6 - (long)pcVar7,uVar8);
          }
          uVar2 = (cmd->file_data)._M_len;
          uVar5 = (ulong)*(uint *)(pcVar3 + 0x20);
          uVar8 = (ulong)*(uint *)(pcVar3 + 0x24);
          if (uVar2 < uVar8 + uVar5) goto LAB_00189063;
          if (uVar5 <= uVar2) {
            pcVar6 = (cmd->file_data)._M_str + uVar5;
            pcVar7 = (sink->file_->data_)._M_str;
            if ((pcVar7 <= pcVar6) && (pcVar6 < pcVar7 + (sink->file_->data_)._M_len)) {
              if (uVar2 - uVar5 < uVar8) {
                uVar8 = uVar2 - uVar5;
              }
              name_03._M_str = "Lazy Binding Info";
              name_03._M_len = 0x11;
              RangeSink::AddFileRange(sink,"macho_dyld",name_03,(long)pcVar6 - (long)pcVar7,uVar8);
            }
            uVar2 = (cmd->file_data)._M_len;
            uVar5 = (ulong)*(uint *)(pcVar3 + 0x28);
            uVar8 = (ulong)*(uint *)(pcVar3 + 0x2c);
            if (uVar2 < uVar8 + uVar5) goto LAB_00189063;
            if (uVar5 <= uVar2) {
              pcVar7 = (cmd->file_data)._M_str + uVar5;
              pcVar3 = (sink->file_->data_)._M_str;
              if (pcVar7 < pcVar3) {
                return;
              }
              if (pcVar3 + (sink->file_->data_)._M_len <= pcVar7) {
                return;
              }
              if (uVar2 - uVar5 < uVar8) {
                uVar8 = uVar2 - uVar5;
              }
              fileoff = (long)pcVar7 - (long)pcVar3;
              pcVar7 = "macho_dyld";
              pcVar3 = "Export Info";
              sVar4 = 0xb;
LAB_00188d67:
              name_04._M_str = pcVar3;
              name_04._M_len = sVar4;
              RangeSink::AddFileRange(sink,pcVar7,name_04,fileoff,uVar8);
              return;
            }
          }
        }
      }
    }
LAB_00189074:
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar5)
    ;
  }
LAB_00189063:
  Throw("region out-of-bounds",0x5d);
}

Assistant:

void ParseLoadCommand(const LoadCommand& cmd, RangeSink* sink) {
  switch (cmd.cmd) {
    case LC_SEGMENT_64:
      ParseSegment<segment_command_64, section_64>(cmd, sink);
      break;
    case LC_SEGMENT:
      ParseSegment<segment_command, section>(cmd, sink);
      break;
    case LC_DYLD_INFO:
    case LC_DYLD_INFO_ONLY:
      ParseDyldInfo(cmd, sink);
      break;
    case LC_SYMTAB:
      ParseSymbolTable(cmd, sink);
      break;
    case LC_DYSYMTAB:
      ParseDynamicSymbolTable(cmd, sink);
      break;
    case LC_CODE_SIGNATURE:
      ParseLinkeditCommand("Code Signature", cmd, sink);
      break;
    case LC_SEGMENT_SPLIT_INFO:
      ParseLinkeditCommand("Segment Split Info", cmd, sink);
      break;
    case LC_FUNCTION_STARTS:
      ParseLinkeditCommand("Function Start Addresses", cmd, sink);
      break;
    case LC_DATA_IN_CODE:
      ParseLinkeditCommand("Table of Non-instructions", cmd, sink);
      break;
    case LC_DYLIB_CODE_SIGN_DRS:
      ParseLinkeditCommand("Code Signing DRs", cmd, sink);
      break;
    case LC_LINKER_OPTIMIZATION_HINT:
      ParseLinkeditCommand("Optimization Hints", cmd, sink);
      break;
  }
}